

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void __thiscall f8n::debug::ConsoleBackend::info(ConsoleBackend *this,string *tag,string *string)

{
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *string_local;
  string *tag_local;
  ConsoleBackend *this_local;
  
  local_20 = string;
  string_local = tag;
  tag_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"info",&local_41);
  writeTo((ostream *)&std::cout,&local_40,string_local,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void debug::ConsoleBackend::info(const std::string& tag, const std::string& string) {
        writeTo(std::cout, "info", tag, string);
    }